

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

int pfx_table_create_node(trie_node **node,pfx_record *record)

{
  long lVar1;
  trie_node *ptVar2;
  void *pvVar3;
  long in_FS_OFFSET;
  int local_2c;
  int err;
  pfx_record *record_local;
  trie_node **node_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = (trie_node *)lrtr_malloc(0x40);
  *node = ptVar2;
  if (*node == (trie_node *)0x0) {
    node_local._4_4_ = -1;
  }
  else {
    ptVar2 = *node;
    *(undefined8 *)&ptVar2->prefix = *(undefined8 *)&record->prefix;
    *(undefined8 *)((long)&(ptVar2->prefix).u + 4) = *(undefined8 *)((long)&(record->prefix).u + 4);
    (ptVar2->prefix).u.addr6.addr[3] = (record->prefix).u.addr6.addr[3];
    (*node)->len = record->min_len;
    (*node)->lchild = (trie_node *)0x0;
    (*node)->rchild = (trie_node *)0x0;
    (*node)->parent = (trie_node *)0x0;
    pvVar3 = lrtr_malloc(0x10);
    (*node)->data = pvVar3;
    if ((*node)->data == (void *)0x0) {
      local_2c = -1;
    }
    else {
      *(undefined4 *)(*node)->data = 0;
      *(undefined8 *)((long)(*node)->data + 8) = 0;
      local_2c = pfx_table_append_elem((node_data *)(*node)->data,record);
      if (local_2c == 0) {
        node_local._4_4_ = 0;
        goto LAB_00106462;
      }
      lrtr_free((*node)->data);
    }
    lrtr_free(*node);
    node_local._4_4_ = local_2c;
  }
LAB_00106462:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return node_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int pfx_table_create_node(struct trie_node **node, const struct pfx_record *record)
{
	int err;

	*node = lrtr_malloc(sizeof(struct trie_node));
	if (!*node)
		return PFX_ERROR;

	(*node)->prefix = record->prefix;
	(*node)->len = record->min_len;
	(*node)->lchild = NULL;
	(*node)->rchild = NULL;
	(*node)->parent = NULL;

	(*node)->data = lrtr_malloc(sizeof(struct node_data));
	if (!(*node)->data) {
		err = PFX_ERROR;
		goto free_node;
	}

	((struct node_data *)(*node)->data)->len = 0;
	((struct node_data *)(*node)->data)->ary = NULL;

	err = pfx_table_append_elem(((struct node_data *)(*node)->data), record);
	if (err)
		goto free_node_data;

	return PFX_SUCCESS;

free_node_data:
	lrtr_free((*node)->data);
free_node:
	lrtr_free(*node);

	return err;
}